

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O3

void __thiscall ftxui::ContainerBase::MoveSelectorWrap(ContainerBase *this,int dir)

{
  char cVar1;
  pointer psVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  
  psVar2 = (this->super_ComponentBase).children_.
           super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (long)(this->super_ComponentBase).children_.
                super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4;
  if (1 < uVar3) {
    uVar4 = 1;
    lVar5 = (long)dir;
    do {
      iVar6 = (int)((*this->selector_ + lVar5 + uVar3) % uVar3);
      cVar1 = (**(code **)((long)(psVar2[iVar6].
                                  super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ComponentBase + 0x28))();
      if (cVar1 != '\0') {
        *this->selector_ = iVar6;
        return;
      }
      uVar4 = uVar4 + 1;
      psVar2 = (this->super_ComponentBase).children_.
               super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = (long)(this->super_ComponentBase).children_.
                    super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4;
      lVar5 = lVar5 + dir;
    } while (uVar4 < uVar3);
  }
  return;
}

Assistant:

void MoveSelectorWrap(int dir) {
    for (size_t offset = 1; offset < children_.size(); ++offset) {
      int i = (*selector_ + offset * dir + children_.size()) % children_.size();
      if (children_[i]->Focusable()) {
        *selector_ = i;
        return;
      }
    }
  }